

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOption
          (Parser *this,Message *options,LocationRecorder *options_location,
          FileDescriptorProto *containing_file,OptionStyle style)

{
  LocationRecorder *this_00;
  ErrorCollector *pEVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  FieldDescriptor *pFVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UninterpretedOption *uninterpreted_option;
  long lVar8;
  Parser *pPVar9;
  FileDescriptorProto *containing_file_00;
  uint uVar10;
  LocationRecorder *this_01;
  LocationRecorder name_location;
  LocationRecorder part_location;
  LocationRecorder location;
  undefined1 local_c8 [16];
  undefined1 local_b8 [59];
  LogFinisher local_7d [5];
  LocationRecorder local_78;
  undefined1 local_68 [56];
  
  local_7d._1_4_ = style;
  iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"uninterpreted_option","");
  pFVar6 = Descriptor::FindFieldByName
                     ((Descriptor *)CONCAT44(extraout_var,iVar4),(string *)local_68);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if (pFVar6 == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x50e);
    pLVar7 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,"CHECK failed: uninterpreted_option_field != NULL: ")
    ;
    pLVar7 = internal::LogMessage::operator<<
                       (pLVar7,"No field named \"uninterpreted_option\" in the Options proto.");
    internal::LogFinisher::operator=((LogFinisher *)local_c8,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
  }
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x16])(options);
  iVar4 = *(int *)(pFVar6 + 0x38);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x30))
                    ((long *)CONCAT44(extraout_var_00,iVar5),options,pFVar6);
  LocationRecorder::LocationRecorder(&local_78,options_location,iVar4,iVar5);
  if ((local_7d._1_4_ != OPTION_STATEMENT) || (bVar2 = Consume(this,"option"), bVar2)) {
    iVar4 = (*(options->super_MessageLite)._vptr_MessageLite[0x16])(options);
    containing_file_00 = (FileDescriptorProto *)0x0;
    uninterpreted_option =
         (UninterpretedOption *)
         (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 600))
                   ((long *)CONCAT44(extraout_var_01,iVar4),options,pFVar6);
    if (uninterpreted_option != (UninterpretedOption *)0x0) {
      containing_file_00 = (FileDescriptorProto *)0x0;
      lVar8 = __dynamic_cast(uninterpreted_option,&Message::typeinfo,&UninterpretedOption::typeinfo)
      ;
      if (lVar8 == 0) {
        __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/casts.h"
                      ,0x5b,
                      "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::UninterpretedOption *, From = google::protobuf::Message]"
                     );
      }
    }
    LocationRecorder::LocationRecorder((LocationRecorder *)local_c8,&local_78,2);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_c8,(Message *)uninterpreted_option,OPTION_NAME);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)(local_b8 + 0x28),(LocationRecorder *)local_c8,
               (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_);
    bVar2 = ParseOptionNamePart(this,uninterpreted_option,(LocationRecorder *)(local_b8 + 0x28),
                                containing_file_00);
    LocationRecorder::~LocationRecorder((LocationRecorder *)(local_b8 + 0x28));
    this_01 = (LocationRecorder *)local_c8;
    if (bVar2) {
      this_00 = (LocationRecorder *)(local_b8 + 0x28);
      do {
        iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar4 != 0) {
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_c8);
          bVar2 = Consume(this,"=");
          if (!bVar2) goto LAB_002cf937;
          LocationRecorder::LocationRecorder((LocationRecorder *)(local_b8 + 0x28),&local_78);
          LocationRecorder::RecordLegacyLocation
                    ((LocationRecorder *)(local_b8 + 0x28),(Message *)uninterpreted_option,
                     OPTION_VALUE);
          bVar2 = TryConsume(this,"-");
          switch((this->input_->current_).type) {
          case TYPE_START:
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                       ,0x543);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)local_c8,
                                "Trying to read value before any tokens have been read.");
            internal::LogFinisher::operator=(local_7d,pLVar7);
            internal::LogMessage::~LogMessage((LogMessage *)local_c8);
            break;
          case TYPE_END:
            local_c8._0_8_ = local_b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"Unexpected end of stream while parsing option value.","")
            ;
            pEVar1 = this->error_collector_;
            if (pEVar1 != (ErrorCollector *)0x0) {
              (*pEVar1->_vptr_ErrorCollector[2])
                        (pEVar1,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,local_c8);
            }
LAB_002cfbea:
            this->had_errors_ = true;
            if ((Parser *)local_c8._0_8_ != (Parser *)local_b8) goto LAB_002cfbf7;
            break;
          case TYPE_IDENTIFIER:
            LocationRecorder::AddPath((LocationRecorder *)(local_b8 + 0x28),3);
            if (bVar2) {
              local_c8._0_8_ = local_b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c8,"Invalid \'-\' symbol before identifier.","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,local_c8);
              }
              goto LAB_002cfbea;
            }
            local_c8._0_8_ = local_b8;
            local_c8._8_8_ = (Location *)0x0;
            local_b8[0] = '\0';
            bVar2 = ConsumeIdentifier(this,(string *)local_c8,"Expected identifier.");
            if (!bVar2) goto LAB_002cfcac;
            UninterpretedOption::set_identifier_value(uninterpreted_option,(string *)local_c8);
LAB_002cfc88:
            if ((Parser *)local_c8._0_8_ != (Parser *)local_b8) {
              operator_delete((void *)local_c8._0_8_,CONCAT71(local_b8._1_7_,local_b8[0]) + 1);
            }
            if (bVar2 != false) goto switchD_002cf9c2_default;
            break;
          case TYPE_INTEGER:
            bVar3 = ConsumeInteger64(this,(ulong)bVar2 - 1 | 0x8000000000000000,(uint64 *)local_c8,
                                     "Expected integer.");
            if (bVar3) {
              if (bVar2) {
                LocationRecorder::AddPath((LocationRecorder *)(local_b8 + 0x28),5);
                lVar8 = 0x50;
                uVar10 = 0x10;
                pPVar9 = (Parser *)-local_c8._0_8_;
              }
              else {
                LocationRecorder::AddPath((LocationRecorder *)(local_b8 + 0x28),4);
                lVar8 = 0x48;
                uVar10 = 8;
                pPVar9 = (Parser *)local_c8._0_8_;
              }
              (uninterpreted_option->_has_bits_).has_bits_[0] =
                   (uninterpreted_option->_has_bits_).has_bits_[0] | uVar10;
              *(Parser **)
               ((long)&(((UninterpretedOption *)(&uninterpreted_option->_has_bits_ + -4))->
                       super_Message).super_MessageLite._vptr_MessageLite + lVar8) = pPVar9;
              if (bVar3) goto switchD_002cf9c2_default;
            }
            break;
          case TYPE_FLOAT:
            LocationRecorder::AddPath((LocationRecorder *)(local_b8 + 0x28),6);
            bVar3 = ConsumeNumber(this,(double *)local_c8,"Expected number.");
            if (bVar3) {
              pPVar9 = (Parser *)local_c8._0_8_;
              if (bVar2) {
                pPVar9 = (Parser *)(local_c8._0_8_ ^ 0x8000000000000000);
              }
              (uninterpreted_option->_has_bits_).has_bits_[0] =
                   (uninterpreted_option->_has_bits_).has_bits_[0] | 0x20;
              uninterpreted_option->double_value_ = (double)pPVar9;
              goto switchD_002cf9c2_default;
            }
            break;
          case TYPE_STRING:
            LocationRecorder::AddPath((LocationRecorder *)(local_b8 + 0x28),7);
            if (bVar2) {
              local_c8._0_8_ = local_b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c8,"Invalid \'-\' symbol before string.","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,local_c8);
              }
              goto LAB_002cfbea;
            }
            local_c8._0_8_ = local_b8;
            local_c8._8_8_ = (Location *)0x0;
            local_b8[0] = '\0';
            bVar2 = ConsumeString(this,(string *)local_c8,"Expected string.");
            if (bVar2) {
              UninterpretedOption::set_string_value(uninterpreted_option,(string *)local_c8);
              goto LAB_002cfc88;
            }
LAB_002cfcac:
            if ((Parser *)local_c8._0_8_ == (Parser *)local_b8) break;
LAB_002cfbf7:
            operator_delete((void *)local_c8._0_8_,CONCAT71(local_b8._1_7_,local_b8[0]) + 1);
            break;
          case TYPE_SYMBOL:
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 != 0) {
              local_c8._0_8_ = local_b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c8,"Expected option value.","");
              pEVar1 = this->error_collector_;
              if (pEVar1 != (ErrorCollector *)0x0) {
                (*pEVar1->_vptr_ErrorCollector[2])
                          (pEVar1,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,local_c8);
              }
              goto LAB_002cfbea;
            }
            LocationRecorder::AddPath((LocationRecorder *)(local_b8 + 0x28),8);
            *(byte *)(uninterpreted_option->_has_bits_).has_bits_ =
                 (byte)(uninterpreted_option->_has_bits_).has_bits_[0] | 4;
            if ((uninterpreted_option->aggregate_value_).ptr_ ==
                (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
              internal::ArenaStringPtr::CreateInstanceNoArena
                        (&uninterpreted_option->aggregate_value_,
                         (string *)&internal::fixed_address_empty_string_abi_cxx11_);
            }
            bVar2 = ParseUninterpretedBlock(this,(uninterpreted_option->aggregate_value_).ptr_);
            if (bVar2) goto switchD_002cf9c2_default;
            break;
          default:
switchD_002cf9c2_default:
            LocationRecorder::~LocationRecorder((LocationRecorder *)(local_b8 + 0x28));
            if ((local_7d._1_4_ == OPTION_STATEMENT) &&
               (bVar2 = ConsumeEndOfDeclaration(this,";",&local_78), !bVar2)) goto LAB_002cf937;
            bVar2 = true;
            goto LAB_002cf939;
          }
          this_01 = (LocationRecorder *)(local_b8 + 0x28);
          break;
        }
        bVar2 = Consume(this,".");
        this_01 = (LocationRecorder *)local_c8;
        if (!bVar2) break;
        LocationRecorder::LocationRecorder
                  (this_00,(LocationRecorder *)local_c8,
                   (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_);
        bVar2 = ParseOptionNamePart(this,uninterpreted_option,this_00,containing_file_00);
        LocationRecorder::~LocationRecorder(this_00);
        this_01 = (LocationRecorder *)local_c8;
      } while (bVar2);
    }
    LocationRecorder::~LocationRecorder(this_01);
  }
LAB_002cf937:
  bVar2 = false;
LAB_002cf939:
  LocationRecorder::~LocationRecorder(&local_78);
  return bVar2;
}

Assistant:

bool Parser::ParseOption(Message* options,
                         const LocationRecorder& options_location,
                         const FileDescriptorProto* containing_file,
                         OptionStyle style) {
  // Create an entry in the uninterpreted_option field.
  const FieldDescriptor* uninterpreted_option_field = options->GetDescriptor()->
      FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(uninterpreted_option_field != NULL)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const Reflection* reflection = options->GetReflection();

  LocationRecorder location(
      options_location, uninterpreted_option_field->number(),
      reflection->FieldSize(*options, uninterpreted_option_field));

  if (style == OPTION_STATEMENT) {
    DO(Consume("option"));
  }

  UninterpretedOption* uninterpreted_option = down_cast<UninterpretedOption*>(
      options->GetReflection()->AddMessage(options,
                                           uninterpreted_option_field));

  // Parse dot-separated name.
  {
    LocationRecorder name_location(location,
                                   UninterpretedOption::kNameFieldNumber);
    name_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_NAME);

    {
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }

    while (LookingAt(".")) {
      DO(Consume("."));
      LocationRecorder part_location(name_location,
                                     uninterpreted_option->name_size());
      DO(ParseOptionNamePart(uninterpreted_option, part_location,
                             containing_file));
    }
  }

  DO(Consume("="));

  {
    LocationRecorder value_location(location);
    value_location.RecordLegacyLocation(
        uninterpreted_option, DescriptorPool::ErrorCollector::OPTION_VALUE);

    // All values are a single token, except for negative numbers, which consist
    // of a single '-' symbol, followed by a positive number.
    bool is_negative = TryConsume("-");

    switch (input_->current().type) {
      case io::Tokenizer::TYPE_START:
        GOOGLE_LOG(FATAL) << "Trying to read value before any tokens have been read.";
        return false;

      case io::Tokenizer::TYPE_END:
        AddError("Unexpected end of stream while parsing option value.");
        return false;

      case io::Tokenizer::TYPE_IDENTIFIER: {
        value_location.AddPath(
            UninterpretedOption::kIdentifierValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before identifier.");
          return false;
        }
        string value;
        DO(ConsumeIdentifier(&value, "Expected identifier."));
        uninterpreted_option->set_identifier_value(value);
        break;
      }

      case io::Tokenizer::TYPE_INTEGER: {
        uint64 value;
        uint64 max_value =
            is_negative ? static_cast<uint64>(kint64max) + 1 : kuint64max;
        DO(ConsumeInteger64(max_value, &value, "Expected integer."));
        if (is_negative) {
          value_location.AddPath(
              UninterpretedOption::kNegativeIntValueFieldNumber);
          uninterpreted_option->set_negative_int_value(
              -static_cast<int64>(value));
        } else {
          value_location.AddPath(
              UninterpretedOption::kPositiveIntValueFieldNumber);
          uninterpreted_option->set_positive_int_value(value);
        }
        break;
      }

      case io::Tokenizer::TYPE_FLOAT: {
        value_location.AddPath(UninterpretedOption::kDoubleValueFieldNumber);
        double value;
        DO(ConsumeNumber(&value, "Expected number."));
        uninterpreted_option->set_double_value(is_negative ? -value : value);
        break;
      }

      case io::Tokenizer::TYPE_STRING: {
        value_location.AddPath(UninterpretedOption::kStringValueFieldNumber);
        if (is_negative) {
          AddError("Invalid '-' symbol before string.");
          return false;
        }
        string value;
        DO(ConsumeString(&value, "Expected string."));
        uninterpreted_option->set_string_value(value);
        break;
      }

      case io::Tokenizer::TYPE_SYMBOL:
        if (LookingAt("{")) {
          value_location.AddPath(
              UninterpretedOption::kAggregateValueFieldNumber);
          DO(ParseUninterpretedBlock(
              uninterpreted_option->mutable_aggregate_value()));
        } else {
          AddError("Expected option value.");
          return false;
        }
        break;
    }
  }

  if (style == OPTION_STATEMENT) {
    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}